

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O1

void __thiscall
absl::strings_internal::AppendPieces
          (strings_internal *this,string *dest,initializer_list<absl::string_view> pieces)

{
  ulong uVar1;
  long lVar2;
  size_t __n;
  _Alloc_hider *p_Var3;
  long lVar4;
  iterator psVar5;
  ulong uVar6;
  size_t this_size;
  void *__dest;
  
  psVar5 = pieces._M_array;
  uVar1 = *(ulong *)(this + 8);
  uVar6 = uVar1;
  if (psVar5 != (iterator)0x0) {
    lVar4 = 0;
    do {
      lVar2 = *(long *)((long)&dest->_M_string_length + lVar4);
      if ((lVar2 != 0) &&
         ((ulong)(*(long *)((long)&(dest->_M_dataplus)._M_p + lVar4) - *(long *)this) <= uVar1)) {
        __assert_fail("((piece).size() == 0) || (uintptr_t((piece).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                      ,0xaa,
                      "void absl::strings_internal::AppendPieces(string *, std::initializer_list<absl::string_view>)"
                     );
      }
      uVar6 = uVar6 + lVar2;
      lVar4 = lVar4 + 0x10;
    } while ((long)psVar5 * 0x10 != lVar4);
  }
  std::__cxx11::string::resize((ulong)this,(char)uVar6);
  lVar4 = *(long *)this;
  __dest = (void *)(uVar1 + lVar4);
  if (psVar5 != (iterator)0x0) {
    p_Var3 = &dest->_M_dataplus;
    do {
      __n = dest->_M_string_length;
      memcpy(__dest,(dest->_M_dataplus)._M_p,__n);
      __dest = (void *)((long)__dest + __n);
      dest = (string *)&dest->field_2;
    } while (dest != (string *)(p_Var3 + (long)psVar5 * 2));
  }
  if (__dest == (void *)(lVar4 + *(long *)(this + 8))) {
    return;
  }
  __assert_fail("out == begin + dest->size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                ,0xb6,
                "void absl::strings_internal::AppendPieces(string *, std::initializer_list<absl::string_view>)"
               );
}

Assistant:

void AppendPieces(string* dest,
                  std::initializer_list<absl::string_view> pieces) {
  size_t old_size = dest->size();
  size_t total_size = old_size;
  for (const absl::string_view piece : pieces) {
    ASSERT_NO_OVERLAP(*dest, piece);
    total_size += piece.size();
  }
  strings_internal::STLStringResizeUninitialized(dest, total_size);

  char* const begin = &*dest->begin();
  char* out = begin + old_size;
  for (const absl::string_view piece : pieces) {
    const size_t this_size = piece.size();
    memcpy(out, piece.data(), this_size);
    out += this_size;
  }
  assert(out == begin + dest->size());
}